

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::TopNHeap::AddLargeHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  anon_struct_16_3_d7536bce_for_pointer *right;
  pointer pTVar6;
  ulong uVar7;
  long lVar8;
  idx_t sel_count;
  anon_union_16_2_67f50693_for_value local_98;
  idx_t local_88;
  DataChunk *local_78;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_70;
  StringHeap *local_68;
  idx_t local_60;
  data_ptr_t local_58;
  idx_t local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  local_78 = input;
  if (input->count == 0) {
    sel_count = 0;
  }
  else {
    local_58 = sort_keys_vec->data;
    local_60 = (this->heap_data).count;
    local_70 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    local_68 = &this->sort_key_heap;
    sel_count = 0;
    uVar7 = 0;
    do {
      right = (anon_struct_16_3_d7536bce_for_pointer *)(local_58 + uVar7 * 0x10);
      pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(((long)(this->heap).
                          super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
                  -0x5555555555555555) < this->heap_size) ||
         (bVar4 = string_t::StringComparisonOperators::GreaterThan
                            (&pTVar2->sort_key,(string_t *)right), bVar4)) {
        if (right->length < 0xd) {
          local_48.pointer = *right;
        }
        else {
          local_48.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(local_68,(string_t *)right);
        }
        local_38 = local_60 + sel_count;
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this->heap_size <= (ulong)(((long)pTVar6 - (long)pTVar2 >> 3) * -0x5555555555555555)) {
          if (0x18 < (long)pTVar6 - (long)pTVar2) {
            local_88 = pTVar6[-1].index;
            local_98._0_8_ = *(undefined8 *)&pTVar6[-1].sort_key.value;
            local_98.pointer.ptr = pTVar6[-1].sort_key.value.pointer.ptr;
            pcVar3 = *(char **)((long)&(pTVar2->sort_key).value + 8);
            *(undefined8 *)&pTVar6[-1].sort_key.value = *(undefined8 *)&(pTVar2->sort_key).value;
            pTVar6[-1].sort_key.value.pointer.ptr = pcVar3;
            pTVar6[-1].index = pTVar2->index;
            ::std::
            __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                      (pTVar2,0,((long)pTVar6 + (-0x18 - (long)pTVar2) >> 3) * -0x5555555555555555);
          }
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + -1;
        }
        __position._M_current =
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
            super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
          _M_realloc_insert<duckdb::TopNEntry_const&>
                    (local_70,__position,(TopNEntry *)&local_48.pointer);
        }
        else {
          (__position._M_current)->index = local_38;
          *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
          ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar6 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_88 = pTVar6[-1].index;
        local_98._0_8_ = *(undefined8 *)&pTVar6[-1].sort_key.value;
        local_98.pointer.ptr = pTVar6[-1].sort_key.value.pointer.ptr;
        lVar5 = ((long)pTVar6 - (long)pTVar2 >> 3) * -0x5555555555555555 + -1;
        local_50 = sel_count;
        if (0x18 < (long)pTVar6 - (long)pTVar2) {
          do {
            lVar8 = (lVar5 - (lVar5 + -1 >> 0x3f)) + -1 >> 1;
            pTVar6 = pTVar2 + lVar8;
            bVar4 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)&local_98.pointer,&pTVar6->sort_key);
            if (!bVar4) break;
            pTVar2[lVar5].index = pTVar6->index;
            pcVar3 = (pTVar6->sort_key).value.pointer.ptr;
            *(undefined8 *)&pTVar2[lVar5].sort_key.value = *(undefined8 *)&(pTVar6->sort_key).value;
            *(char **)((long)&pTVar2[lVar5].sort_key.value + 8) = pcVar3;
            bVar4 = 2 < lVar5;
            lVar5 = lVar8;
          } while (bVar4);
        }
        pTVar2[lVar5].index = local_88;
        *(undefined8 *)&pTVar2[lVar5].sort_key.value = local_98._0_8_;
        *(char **)((long)&pTVar2[lVar5].sort_key.value + 8) = local_98.pointer.ptr;
        (this->matching_sel).sel_vector[local_50] = (sel_t)uVar7;
        sel_count = local_50 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_78->count);
  }
  if (sel_count != 0) {
    DataChunk::Append(&this->heap_data,local_78,true,&this->matching_sel,sel_count);
  }
  return;
}

Assistant:

void TopNHeap::AddLargeHeap(DataChunk &input, Vector &sort_keys_vec) {
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	idx_t base_index = heap_data.size();
	idx_t match_count = 0;
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		entry.index = base_index + match_count;
		AddEntryToHeap(entry);
		matching_sel.set_index(match_count++, r);
	}
	if (match_count == 0) {
		// early-out: no matches
		return;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}